

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void FSE_initDState(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD,FSE_DTable *dt)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  FSE_DTable FVar4;
  size_t *psVar5;
  void *ptr;
  uint uVar6;
  
  FVar4 = *dt;
  uVar6 = bitD->bitsConsumed + (uint)(ushort)FVar4;
  bitD->bitsConsumed = uVar6;
  DStatePtr->state =
       ~(-1L << ((byte)(ushort)FVar4 & 0x3f)) & bitD->bitContainer >> (-(char)uVar6 & 0x3fU);
  if (uVar6 < 0x41) {
    pcVar1 = bitD->ptr;
    if (pcVar1 < bitD->limitPtr) {
      pcVar2 = bitD->start;
      if (pcVar1 == pcVar2) goto LAB_0018d75c;
      uVar3 = (int)pcVar1 - (int)pcVar2;
      if (pcVar2 <= pcVar1 + -(ulong)(uVar6 >> 3)) {
        uVar3 = uVar6 >> 3;
      }
      psVar5 = (size_t *)(pcVar1 + -(ulong)uVar3);
      bitD->ptr = (char *)psVar5;
      uVar6 = uVar6 + uVar3 * -8;
    }
    else {
      psVar5 = (size_t *)(pcVar1 + -(ulong)(uVar6 >> 3));
      bitD->ptr = (char *)psVar5;
      uVar6 = uVar6 & 7;
    }
    bitD->bitsConsumed = uVar6;
    bitD->bitContainer = *psVar5;
  }
LAB_0018d75c:
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

MEM_STATIC void FSE_initDState(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD, const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* const DTableH = (const FSE_DTableHeader*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}